

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildDescription.cpp
# Opt level: O0

Command * __thiscall
llbuild::buildsystem::BuildDescription::addCommand
          (BuildDescription *this,
          unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
          *value)

{
  pointer pCVar1;
  command_set *this_00;
  pointer this_01;
  unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
  *this_02;
  StringRef Key;
  Command *result;
  unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
  *value_local;
  BuildDescription *this_local;
  
  pCVar1 = std::
           unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
           ::get(value);
  this_00 = getCommands(this);
  this_01 = std::
            unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
            ::operator->(value);
  Key = Command::getName(this_01);
  this_02 = llvm::
            StringMap<std::unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>,_llvm::MallocAllocator>
            ::operator[](this_00,Key);
  std::
  unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>::
  operator=(this_02,value);
  return pCVar1;
}

Assistant:

Command& BuildDescription::addCommand(std::unique_ptr<Command> value) {
  auto& result = *value.get();
  getCommands()[value->getName()] = std::move(value);
  return result;
}